

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

uint8_t * __thiscall
pktalloc::Allocator::Reallocate(Allocator *this,uint8_t *ptr,uint bytes,Realloc behavior)

{
  uint uVar1;
  uint8_t *puVar2;
  
  if (ptr == (uint8_t *)0x0) {
    puVar2 = Allocate(this,bytes);
    return puVar2;
  }
  if (bytes == 0) {
    Free(this,ptr);
  }
  else {
    uVar1 = *(uint *)(ptr + -0x18);
    if (bytes + 0x1f >> 5 < uVar1) {
      return ptr;
    }
    puVar2 = Allocate(this,bytes);
    if (puVar2 != (uint8_t *)0x0) {
      if (behavior == CopyExisting) {
        memcpy(puVar2,ptr,(ulong)(uVar1 * 0x20 - 0x20));
      }
      Free(this,ptr);
      return puVar2;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* Allocator::Reallocate(uint8_t* ptr, unsigned bytes, Realloc behavior)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    if (!ptr) {
        return Allocate(bytes);
    }
    if (bytes <= 0) {
        Free(ptr);
        return nullptr;
    }
    PKTALLOC_DEBUG_ASSERT((uintptr_t)ptr % kUnitSize == 0);

    AllocationHeader* regionHeader = (AllocationHeader*)(ptr - kUnitSize);
#ifdef PKTALLOC_DEBUG
    if (regionHeader->Canary != AllocationHeader::kCanaryExpected) {
        PKTALLOC_DEBUG_BREAK(); // Buffer overflow detected
        return nullptr;
    }
    if (regionHeader->IsFreed()) {
        PKTALLOC_DEBUG_BREAK(); // Double-free
        return nullptr;
    }
#endif // PKTALLOC_DEBUG

    const unsigned existingUnits = regionHeader->UsedUnits;
#ifndef PKTALLOC_DISABLE
    PKTALLOC_DEBUG_ASSERT(!regionHeader->Header || existingUnits <= kFallbackThresholdUnits);
#endif // PKTALLOC_DISABLE

    // If the existing allocation is big enough:
    const unsigned requestedUnits = (bytes + kUnitSize - 1) / kUnitSize + 1;
    if (requestedUnits <= existingUnits) {
        return ptr; // No change needed
    }

    // Allocate new data
    uint8_t* newPtr = Allocate(bytes);
    if (!newPtr) {
        return nullptr;
    }

    // Copy old data
    if (behavior == Realloc::CopyExisting) {
        memcpy(newPtr, ptr, (existingUnits - 1) * kUnitSize);
    }

    Free(ptr);

    ALLOC_DEBUG_INTEGRITY_CHECK();

    return newPtr;
}